

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall irr::video::CNullDriver::removeOcclusionQuery(CNullDriver *this,ISceneNode *node)

{
  s32 sVar1;
  u32 uVar2;
  ISceneNode *in_RSI;
  SOccQuery *in_RDI;
  s32 index;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  u32 in_stack_ffffffffffffffcc;
  SOccQuery *in_stack_ffffffffffffffd0;
  array<irr::video::CNullDriver::SOccQuery> *in_stack_ffffffffffffffd8;
  
  SOccQuery::SOccQuery
            ((SOccQuery *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (ISceneNode *)&in_RDI[1].field_2,(IMesh *)in_RDI);
  sVar1 = core::array<irr::video::CNullDriver::SOccQuery>::linear_search
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  SOccQuery::~SOccQuery(in_RDI);
  if (sVar1 != -1) {
    uVar2 = irr::scene::ISceneNode::getAutomaticCulling(in_RSI);
    irr::scene::ISceneNode::setAutomaticCulling(in_RSI,uVar2 & 0xfffffff7);
    core::array<irr::video::CNullDriver::SOccQuery>::erase
              ((array<irr::video::CNullDriver::SOccQuery> *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

void CNullDriver::removeOcclusionQuery(scene::ISceneNode *node)
{
	// search for query
	s32 index = OcclusionQueries.linear_search(SOccQuery(node));
	if (index != -1) {
		node->setAutomaticCulling(node->getAutomaticCulling() & ~scene::EAC_OCC_QUERY);
		OcclusionQueries.erase(index);
	}
}